

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O3

void af_cjk_hints_compute_blue_edges(AF_GlyphHints hints,AF_CJKMetrics metrics,AF_Dimension dim)

{
  long lVar1;
  int iVar2;
  AF_Edge_conflict pAVar3;
  AF_CJKBlue blue;
  AF_Width pAVar4;
  ulong uVar5;
  int iVar6;
  AF_Edge_conflict pAVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  AF_Width pAVar13;
  ulong uVar14;
  AF_Width pAVar15;
  ulong uVar16;
  
  lVar9 = (long)hints->axis[dim].num_edges;
  lVar1 = (long)(int)metrics->axis[dim].scale;
  lVar12 = ((ulong)metrics->units_per_em / 0x28) * lVar1;
  iVar2 = (int)((ulong)((lVar12 >> 0x3f) + lVar12 + 0x8000) >> 0x10);
  iVar11 = 0x20;
  if (iVar2 < 0x20) {
    iVar11 = iVar2;
  }
  if (0 < lVar9) {
    pAVar3 = hints->axis[dim].edges;
    pAVar7 = pAVar3 + lVar9;
    uVar10 = (ulong)metrics->axis[dim].blue_count;
    do {
      if (uVar10 != 0) {
        pAVar13 = (AF_Width)0x0;
        pAVar4 = &metrics->axis[dim].blues[0].ref;
        uVar14 = uVar10;
        iVar2 = iVar11;
        do {
          if (((*(uint *)&pAVar4[2].org & 1) != 0) &&
             (((*(uint *)&pAVar4[2].org & 2) == 0) ==
              (hints->axis[dim].major_dir == (int)pAVar3->dir))) {
            lVar12 = (long)pAVar3->fpos;
            lVar9 = ((AF_WidthRec *)&pAVar4->org)->org;
            uVar16 = lVar12 - lVar9;
            uVar5 = -uVar16;
            if (0 < (long)uVar16) {
              uVar5 = uVar16;
            }
            uVar8 = lVar12 - pAVar4[1].org;
            uVar16 = -uVar8;
            if (0 < (long)uVar8) {
              uVar16 = uVar8;
            }
            pAVar15 = pAVar4;
            if (uVar16 < uVar5) {
              pAVar15 = pAVar4 + 1;
              lVar9 = pAVar4[1].org;
            }
            lVar12 = lVar12 - lVar9;
            lVar9 = -lVar12;
            if (0 < lVar12) {
              lVar9 = lVar12;
            }
            lVar9 = (int)lVar9 * lVar1;
            iVar6 = (int)((ulong)(lVar9 + (lVar9 >> 0x3f) + 0x8000) >> 0x10);
            if (iVar6 < iVar2) {
              pAVar13 = pAVar15;
            }
            if (iVar6 <= iVar2) {
              iVar2 = iVar6;
            }
          }
          pAVar4 = (AF_Width)&pAVar4[2].cur;
          uVar14 = uVar14 - 1;
        } while (uVar14 != 0);
        if (pAVar13 != (AF_Width)0x0) {
          pAVar3->blue_edge = pAVar13;
        }
      }
      pAVar3 = pAVar3 + 1;
    } while (pAVar3 < pAVar7);
  }
  return;
}

Assistant:

static void
  af_cjk_hints_compute_blue_edges( AF_GlyphHints  hints,
                                   AF_CJKMetrics  metrics,
                                   AF_Dimension   dim )
  {
    AF_AxisHints  axis       = &hints->axis[dim];
    AF_Edge       edge       = axis->edges;
    AF_Edge       edge_limit = edge + axis->num_edges;
    AF_CJKAxis    cjk        = &metrics->axis[dim];
    FT_Fixed      scale      = cjk->scale;
    FT_Pos        best_dist0;  /* initial threshold */


    /* compute the initial threshold as a fraction of the EM size */
    best_dist0 = FT_MulFix( metrics->units_per_em / 40, scale );

    if ( best_dist0 > 64 / 2 ) /* maximum 1/2 pixel */
      best_dist0 = 64 / 2;

    /* compute which blue zones are active, i.e. have their scaled */
    /* size < 3/4 pixels                                           */

    /* If the distant between an edge and a blue zone is shorter than */
    /* best_dist0, set the blue zone for the edge.  Then search for   */
    /* the blue zone with the smallest best_dist to the edge.         */

    for ( ; edge < edge_limit; edge++ )
    {
      FT_UInt   bb;
      AF_Width  best_blue = NULL;
      FT_Pos    best_dist = best_dist0;


      for ( bb = 0; bb < cjk->blue_count; bb++ )
      {
        AF_CJKBlue  blue = cjk->blues + bb;
        FT_Bool     is_top_right_blue, is_major_dir;


        /* skip inactive blue zones (i.e., those that are too small) */
        if ( !( blue->flags & AF_CJK_BLUE_ACTIVE ) )
          continue;

        /* if it is a top zone, check for right edges -- if it is a bottom */
        /* zone, check for left edges                                      */
        /*                                                                 */
        /* of course, that's for TrueType                                  */
        is_top_right_blue =
          (FT_Byte)( ( blue->flags & AF_CJK_BLUE_TOP ) != 0 );
        is_major_dir =
          FT_BOOL( edge->dir == axis->major_dir );

        /* if it is a top zone, the edge must be against the major    */
        /* direction; if it is a bottom zone, it must be in the major */
        /* direction                                                  */
        if ( is_top_right_blue ^ is_major_dir )
        {
          FT_Pos    dist;
          AF_Width  compare;


          /* Compare the edge to the closest blue zone type */
          if ( FT_ABS( edge->fpos - blue->ref.org ) >
               FT_ABS( edge->fpos - blue->shoot.org ) )
            compare = &blue->shoot;
          else
            compare = &blue->ref;

          dist = edge->fpos - compare->org;
          if ( dist < 0 )
            dist = -dist;

          dist = FT_MulFix( dist, scale );
          if ( dist < best_dist )
          {
            best_dist = dist;
            best_blue = compare;
          }
        }
      }

      if ( best_blue )
        edge->blue_edge = best_blue;
    }
  }